

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

void __thiscall
dxil_spv::SPIRVModule::Impl::register_active_variable(Impl *this,StorageClass storage,Id id)

{
  Instruction *pIVar1;
  iterator __position;
  uint local_4;
  
  if (this->override_spirv_version == 0) {
    if ((this->execution_model - ExecutionModelRayGenerationKHR < 6) ||
       ((this->execution_model & ~ExecutionModelTessellationControl) == ExecutionModelTaskEXT))
    goto LAB_001a5b8a;
  }
  else if (0x103ff < this->override_spirv_version) {
LAB_001a5b8a:
    if (storage == StorageClassFunction) {
      return;
    }
    goto LAB_001a5b98;
  }
  if ((storage & ~StorageClassUniform) != StorageClassInput) {
    return;
  }
LAB_001a5b98:
  pIVar1 = this->entry_point;
  __position._M_current =
       (pIVar1->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pIVar1->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar1->operands,__position,&local_4);
  }
  else {
    *__position._M_current = id;
    (pIVar1->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

bool SPIRVModule::Impl::spirv_requires_14() const
{
	static const uint32_t Version_1_4 = 0x00010400;
	if (override_spirv_version)
	{
		return override_spirv_version >= Version_1_4;
	}
	else
	{
		return execution_model_is_ray_tracing() || execution_model == spv::ExecutionModelMeshEXT ||
		       execution_model == spv::ExecutionModelTaskEXT;
	}
}